

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

double __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>::
ReadConstant(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>
             *this,char code)

{
  BinaryReader<mp::internal::IdentityConverter> *this_00;
  double *pdVar1;
  short *psVar2;
  int *piVar3;
  int iVar4;
  undefined7 in_register_00000031;
  double dVar5;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_10;
  
  local_10.field_1.values_ = (Value *)&local_28;
  this_00 = this->reader_;
  iVar4 = (int)CONCAT71(in_register_00000031,code);
  if (iVar4 == 0x6c) {
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ =
         (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    piVar3 = (int *)BinaryReaderBase::Read(&this_00->super_BinaryReaderBase,4);
    dVar5 = (double)*piVar3;
  }
  else if (iVar4 == 0x73) {
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ =
         (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    psVar2 = (short *)BinaryReaderBase::Read(&this_00->super_BinaryReaderBase,2);
    dVar5 = (double)(int)*psVar2;
  }
  else if (iVar4 == 0x6e) {
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ =
         (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    pdVar1 = (double *)BinaryReaderBase::Read(&this_00->super_BinaryReaderBase,8);
    dVar5 = *pdVar1;
  }
  else {
    local_28 = 0;
    uStack_20 = 0;
    local_10.types_ = 0;
    BinaryReaderBase::ReportError(&this_00->super_BinaryReaderBase,(CStringRef)0x139eee,&local_10);
    dVar5 = 0.0;
  }
  return dVar5;
}

Assistant:

double NLReader<Reader, Handler>::ReadConstant(char code) {
  double value = 0;
  switch (code) {
  case 'n':
    value = reader_.ReadDouble();
    break;
  case 's':
    value = reader_.template ReadInt<short>();
    break;
  case 'l':
    // The following check is necessary for compatibility with ASL.
    if (sizeof(double) == 2 * sizeof(int))
      value = reader_.template ReadInt<int>();
    else
      value = reader_.template ReadInt<long>();
    break;
  default:
    reader_.ReportError("expected constant");
  }
  reader_.ReadTillEndOfLine();
  return value;
}